

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_decompress4X_DCtx(HUF_DTable *dctx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize)

{
  U32 UVar1;
  size_t sVar2;
  int bmi2;
  undefined1 local_a28 [2560];
  
  if (dstSize != 0) {
    sVar2 = 0xffffffffffffffec;
    if (cSrcSize <= dstSize) {
      sVar2 = dstSize;
      if (cSrcSize == dstSize) {
        memcpy(dst,cSrc,dstSize);
      }
      else if (cSrcSize == 1) {
        memset(dst,(uint)*cSrc,dstSize);
      }
      else {
        bmi2 = 0x71469c;
        UVar1 = HUF_selectDecoder(dstSize,cSrcSize);
        if (UVar1 == 0) {
          sVar2 = HUF_decompress4X1_DCtx_wksp_bmi2(dctx,dst,dstSize,cSrc,cSrcSize,local_a28,0xa00,0)
          ;
        }
        else {
          sVar2 = HUF_decompress4X2_DCtx_wksp_bmi2
                            (dctx,dst,dstSize,cSrc,cSrcSize,local_a28,0xa00,bmi2);
        }
      }
    }
    return sVar2;
  }
  return 0xffffffffffffffba;
}

Assistant:

size_t HUF_decompress4X_DCtx (HUF_DTable* dctx, void* dst, size_t dstSize, const void* cSrc, size_t cSrcSize)
{
    /* validation checks */
    if (dstSize == 0) return ERROR(dstSize_tooSmall);
    if (cSrcSize > dstSize) return ERROR(corruption_detected);   /* invalid */
    if (cSrcSize == dstSize) { ZSTD_memcpy(dst, cSrc, dstSize); return dstSize; }   /* not compressed */
    if (cSrcSize == 1) { ZSTD_memset(dst, *(const BYTE*)cSrc, dstSize); return dstSize; }   /* RLE */

    {   U32 const algoNb = HUF_selectDecoder(dstSize, cSrcSize);
#if defined(HUF_FORCE_DECOMPRESS_X1)
        (void)algoNb;
        assert(algoNb == 0);
        return HUF_decompress4X1_DCtx(dctx, dst, dstSize, cSrc, cSrcSize);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
        (void)algoNb;
        assert(algoNb == 1);
        return HUF_decompress4X2_DCtx(dctx, dst, dstSize, cSrc, cSrcSize);
#else
        return algoNb ? HUF_decompress4X2_DCtx(dctx, dst, dstSize, cSrc, cSrcSize) :
                        HUF_decompress4X1_DCtx(dctx, dst, dstSize, cSrc, cSrcSize) ;
#endif
    }
}